

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O1

uint32_t utf8_encode(char *buffer,uint32_t value)

{
  uint32_t uVar1;
  byte bVar2;
  char *bytes;
  
  bVar2 = (byte)value;
  if (value < 0x80) {
    *buffer = bVar2;
    return 1;
  }
  if (value < 0x800) {
    *buffer = (byte)(value >> 6) | 0xc0;
    buffer[1] = bVar2 & 0x3f | 0x80;
    return 2;
  }
  if (value < 0x10000) {
    *buffer = (byte)(value >> 0xc) | 0xe0;
    buffer[1] = (byte)(value >> 6) & 0x3f | 0x80;
    buffer[2] = bVar2 & 0x3f | 0x80;
    return 3;
  }
  uVar1 = 0;
  if (value < 0x110000) {
    *buffer = (byte)(value >> 0x12) | 0xf0;
    buffer[1] = (byte)(value >> 0xc) & 0x3f | 0x80;
    buffer[2] = (byte)(value >> 6) & 0x3f | 0x80;
    buffer[3] = bVar2 & 0x3f | 0x80;
    uVar1 = 4;
  }
  return uVar1;
}

Assistant:

uint32_t utf8_encode(char *buffer, uint32_t value) {
    char *bytes = buffer;
    
    if (value <= 0x7f) {
        // single byte (i.e. fits in ASCII).
        *bytes = (char)(value & 0x7f);
        return 1;
    }
    
    if (value <= 0x7ff) {
        // two byte sequence: 110xxxxx 10xxxxxx.
        *bytes = (char)(0xc0 | ((value & 0x7c0) >> 6));
        ++bytes;
        *bytes = (char)(0x80 | (value & 0x3f));
        return 2;
    }
    
    if (value <= 0xffff) {
        // three byte sequence: 1110xxxx 10xxxxxx 10xxxxxx.
        *bytes = (char)(0xe0 | ((value & 0xf000) >> 12));
        ++bytes;
        *bytes = (char)(0x80 | ((value & 0xfc0) >> 6));
        ++bytes;
        *bytes = (char)(0x80 | (value & 0x3f));
        return 3;
    }
    
    if (value <= 0x10ffff) {
        // four byte sequence: 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx.
        *bytes = (char)(0xf0 | ((value & 0x1c0000) >> 18));
        ++bytes;
        *bytes = (char)(0x80 | ((value & 0x3f000) >> 12));
        ++bytes;
        *bytes = (char)(0x80 | ((value & 0xfc0) >> 6));
        ++bytes;
        *bytes = (char)(0x80 | (value & 0x3f));
        return 4;
    }
    
    return 0;
}